

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::ParseCCCharacter
          (ParseState *this,StringPiece *s,Rune *rp,StringPiece *whole_class,RegexpStatus *status)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pcVar4;
  StringPiece *in_RCX;
  StringPiece *in_RSI;
  RegexpStatus *in_R8;
  int in_stack_00000044;
  RegexpStatus *in_stack_00000048;
  Rune *in_stack_00000050;
  StringPiece *in_stack_00000058;
  bool local_1;
  
  sVar3 = StringPiece::size(in_RSI);
  if (sVar3 == 0) {
    RegexpStatus::set_code(in_R8,kRegexpMissingBracket);
    RegexpStatus::set_error_arg(in_R8,in_RCX);
    local_1 = false;
  }
  else {
    sVar3 = StringPiece::size(in_RSI);
    if ((sVar3 != 0) && (pcVar4 = StringPiece::operator[](in_RSI,0), *pcVar4 == '\\')) {
      bVar1 = ParseEscape(in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044);
      return bVar1;
    }
    iVar2 = StringPieceToRune(rp,whole_class,status);
    local_1 = -1 < iVar2;
  }
  return local_1;
}

Assistant:

bool Regexp::ParseState::ParseCCCharacter(StringPiece* s, Rune *rp,
                                          const StringPiece& whole_class,
                                          RegexpStatus* status) {
  if (s->size() == 0) {
    status->set_code(kRegexpMissingBracket);
    status->set_error_arg(whole_class);
    return false;
  }

  // Allow regular escape sequences even though
  // many need not be escaped in this context.
  if (s->size() >= 1 && (*s)[0] == '\\')
    return ParseEscape(s, rp, status, rune_max_);

  // Otherwise take the next rune.
  return StringPieceToRune(rp, s, status) >= 0;
}